

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall
aalcalc::calculatemeansddev<aal_rec_period>
          (aalcalc *this,aal_rec_period *record,int sample_size,int p1,int p2,int periods,
          double *mean,double *sd_dev)

{
  double dVar1;
  
  *mean = (record->super_aal_rec).mean / (double)sample_size;
  dVar1 = (record->super_aal_rec).mean;
  dVar1 = ((record->super_aal_rec).mean_squared - (dVar1 * dVar1) / (double)p1) / (double)p2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  *sd_dev = dVar1;
  *mean = *mean / (double)periods;
  return;
}

Assistant:

inline void aalcalc::calculatemeansddev(const aal_rec_T &record,
					const int sample_size, const int p1,
					const int p2, const int periods,
					double &mean, double &sd_dev) {

	mean = record.mean / sample_size;
	double mean_squared = record.mean * record.mean;
	double s1 = record.mean_squared - mean_squared / p1;
	double s2 = s1 / p2;
	sd_dev = sqrt(s2);
	mean = mean / periods;

}